

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool_test.cc
# Opt level: O3

void __thiscall TokenPoolTestClear::~TokenPoolTestClear(TokenPoolTestClear *this)

{
  operator_delete(this,0x428);
  return;
}

Assistant:

TEST_F(TokenPoolTest, Clear) {
  CreateDefaultPool();

  ASSERT_NE(NULL, tokens_);
  EXPECT_EQ(kLoadAverageDefault, load_avg_);

  // implicit token
  EXPECT_TRUE(tokens_->Acquire());
  tokens_->Reserve();
  EXPECT_FALSE(tokens_->Acquire());

  // jobserver offers 2nd & 3rd token
#ifdef _WIN32
  LONG previous;
  ASSERT_TRUE(ReleaseSemaphore(semaphore_, 2, &previous));
  ASSERT_EQ(0, previous);
#else
  ASSERT_EQ(2u, write(fds_[1], "TT", 2));
#endif
  EXPECT_TRUE(tokens_->Acquire());
  tokens_->Reserve();
  EXPECT_TRUE(tokens_->Acquire());
  tokens_->Reserve();
  EXPECT_FALSE(tokens_->Acquire());

  tokens_->Clear();
  EXPECT_TRUE(tokens_->Acquire());

  // there must be two tokens available
#ifdef _WIN32
  EXPECT_EQ(WAIT_OBJECT_0, WaitForSingleObject(semaphore_, 0));
  EXPECT_EQ(WAIT_OBJECT_0, WaitForSingleObject(semaphore_, 0));
  EXPECT_TRUE(ReleaseSemaphore(semaphore_, 2, &previous));
  EXPECT_EQ(0, previous);
#else
  EXPECT_EQ(2u, read(fds_[0], buf_, sizeof(buf_)));
#endif

  // implicit token
  EXPECT_TRUE(tokens_->Acquire());
}